

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.h
# Opt level: O0

void __thiscall
slang::ast::ExplicitImportSymbol::ExplicitImportSymbol
          (ExplicitImportSymbol *this,string_view packageName,string_view importName,
          SourceLocation location)

{
  string_view name;
  char *in_RCX;
  size_t in_RDX;
  undefined8 in_RSI;
  Symbol *in_RDI;
  SourceLocation in_R8;
  SourceLocation in_R9;
  
  name._M_str = (char *)in_R8;
  name._M_len = (size_t)in_RCX;
  Symbol::Symbol(in_RDI,ExplicitImport,name,in_R9);
  *(undefined8 *)(in_RDI + 1) = in_RSI;
  in_RDI[1].name._M_len = in_RDX;
  in_RDI[1].name._M_str = in_RCX;
  in_RDI[1].location = in_R8;
  *(undefined1 *)&in_RDI[1].parentScope = 0;
  in_RDI[1].nextInScope = (Symbol *)0x0;
  *(undefined8 *)&in_RDI[1].indexInScope = 0;
  *(undefined1 *)&in_RDI[1].originatingSyntax = 0;
  return;
}

Assistant:

ExplicitImportSymbol(std::string_view packageName, std::string_view importName,
                         SourceLocation location) :
        Symbol(SymbolKind::ExplicitImport, importName, location), packageName(packageName),
        importName(importName) {}